

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O0

Pipeline * __thiscall
capnp::Request<capnp::AnyPointer,_capnp::AnyPointer>::sendForPipeline
          (Pipeline *__return_storage_ptr__,Request<capnp::AnyPointer,_capnp::AnyPointer> *this)

{
  RequestHook *pRVar1;
  Pipeline *pPVar2;
  undefined1 local_40 [8];
  Pipeline typelessPipeline;
  Request<capnp::AnyPointer,_capnp::AnyPointer> *this_local;
  
  typelessPipeline.ops.disposer = (ArrayDisposer *)this;
  pRVar1 = kj::Own<capnp::RequestHook,_std::nullptr_t>::operator->(&this->hook);
  (*pRVar1->_vptr_RequestHook[2])(local_40);
  kj::Own<capnp::RequestHook,_std::nullptr_t>::operator=(&this->hook,(void *)0x0);
  pPVar2 = kj::mv<capnp::AnyPointer::Pipeline>((Pipeline *)local_40);
  AnyPointer::Pipeline::Pipeline(__return_storage_ptr__,pPVar2);
  AnyPointer::Pipeline::~Pipeline((Pipeline *)local_40);
  return __return_storage_ptr__;
}

Assistant:

typename Results::Pipeline Request<Params, Results>::sendForPipeline() {
  auto typelessPipeline = hook->sendForPipeline();
  hook = nullptr;  // prevent reuse
  return typename Results::Pipeline(kj::mv(typelessPipeline));
}